

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void get_phys_addr_pmsav7_default
               (CPUARMState_conflict *env,ARMMMUIdx mmu_idx,int32_t address,int *prot)

{
  int iVar1;
  uint64_t uVar2;
  int *prot_local;
  int32_t address_local;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_feature(env,9);
  if (iVar1 == 0) {
    *prot = 3;
    if ((uint)address < 0xf0000000) {
      if (-1 < address) {
        *prot = *prot | 4;
      }
    }
    else {
      uVar2 = regime_sctlr(env,mmu_idx);
      if ((uVar2 & 0x2000) != 0) {
        *prot = *prot | 4;
      }
    }
  }
  else if (((((address < 0) || (0x1fffffff < address)) &&
            ((address < 0x20000000 || (0x3fffffff < address)))) &&
           ((address < 0x60000000 || (0x7fffffff < address)))) &&
          (((uint)address < 0x80000000 || (0x9fffffff < (uint)address)))) {
    if ((((0x3fffffff < address) && (address < 0x60000000)) ||
        ((0x9fffffff < (uint)address && ((uint)address < 0xc0000000)))) ||
       (((0xbfffffff < (uint)address && ((uint)address < 0xe0000000)) ||
        (0xdfffffff < (uint)address)))) {
      *prot = 3;
    }
  }
  else {
    *prot = 7;
  }
  return;
}

Assistant:

static inline void get_phys_addr_pmsav7_default(CPUARMState *env,
                                                ARMMMUIdx mmu_idx,
                                                int32_t address, int *prot)
{
#define XRANGE(a, x, y) (a >=x && a <= y)
    if (!arm_feature(env, ARM_FEATURE_M)) {
        *prot = PAGE_READ | PAGE_WRITE;
        if (XRANGE(address, 0xF0000000, 0xFFFFFFFF)) {
            if (regime_sctlr(env, mmu_idx) & SCTLR_V) {
                /* hivecs execing is ok */
                *prot |= PAGE_EXEC;
            }
        } else if (XRANGE(address, 0x00000000, 0x7FFFFFFF)) {
            *prot |= PAGE_EXEC;
        }
    } else {
        /* Default system address map for M profile cores.
         * The architecture specifies which regions are execute-never;
         * at the MPU level no other checks are defined.
         */
        if (XRANGE(address, 0x00000000, 0x1fffffff) || /* ROM */
                XRANGE(address, 0x20000000, 0x3fffffff) || /* SRAM */
                XRANGE(address, 0x60000000, 0x7fffffff) || /* RAM */
                XRANGE(address, 0x80000000, 0x9fffffff)) /* RAM */
            *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;

        else if (XRANGE(address, 0x40000000, 0x5fffffff) || /* Peripheral */
                XRANGE(address, 0xa0000000, 0xbfffffff) || /* Device */
                XRANGE(address, 0xc0000000, 0xdfffffff) || /* Device */
                XRANGE(address, 0xe0000000, 0xffffffff)) /* System */
            *prot = PAGE_READ | PAGE_WRITE;
    }
#undef XRANGE
}